

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O2

size_t __thiscall
capnp::_::PackedInputStream::tryRead
          (PackedInputStream *this,void *dst,size_t minBytes,size_t maxBytes)

{
  byte *pbVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  byte bVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  size_t extraout_RDX;
  byte *pbVar8;
  uint uVar9;
  byte bVar10;
  uchar *__n;
  byte *pbVar11;
  long lVar12;
  uchar *__n_00;
  void *__buf;
  ArrayPtr<const_unsigned_char> AVar13;
  Fault f;
  
  if (maxBytes == 0) {
    return 0;
  }
  iVar3 = (*(this->inner->super_InputStream)._vptr_InputStream[4])();
  pbVar8 = (byte *)CONCAT44(extraout_var,iVar3);
  AVar13.size_ = extraout_RDX;
  AVar13.ptr = pbVar8;
  if (extraout_RDX == 0) {
    return 0;
  }
  pbVar1 = (byte *)((long)dst + maxBytes);
  pbVar11 = (byte *)dst;
LAB_00298f3f:
  pbVar5 = AVar13.ptr + AVar13.size_;
  if ((ulong)((long)pbVar5 - (long)pbVar8) < 10) {
    if ((byte *)(minBytes + (long)dst) <= pbVar11) {
      (*(this->inner->super_InputStream)._vptr_InputStream[3])
                (this->inner,(long)pbVar8 - (long)AVar13.ptr);
      return (size_t)(pbVar11 + -(long)dst);
    }
    if (pbVar5 == pbVar8) {
      (*(this->inner->super_InputStream)._vptr_InputStream[3])();
      AVar13 = kj::BufferedInputStream::getReadBuffer(this->inner);
      pbVar8 = AVar13.ptr;
      if (AVar13.size_ == 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                   ,0x4d,FAILED,"buffer.size() > 0","\"Premature end of packed input.\"",
                   (char (*) [31])"Premature end of packed input.");
        lVar12 = -(long)dst;
LAB_002992cc:
        kj::_::Debug::Fault::~Fault(&f);
        return (size_t)(pbVar11 + lVar12);
      }
      goto LAB_00298f3f;
    }
    bVar10 = *pbVar8;
    pbVar8 = pbVar8 + 1;
    lVar12 = 0;
    while( true ) {
      if ((uint)lVar12 == 8) break;
      if ((bVar10 >> ((uint)lVar12 & 0x1f) & 1) == 0) {
        bVar4 = 0;
      }
      else {
        if (AVar13.ptr + AVar13.size_ == pbVar8) {
          (*(this->inner->super_InputStream)._vptr_InputStream[3])();
          AVar13 = kj::BufferedInputStream::getReadBuffer(this->inner);
          pbVar8 = AVar13.ptr;
          if (AVar13.size_ == 0) {
            iVar3 = 0x59;
            goto LAB_002992fd;
          }
        }
        bVar4 = *pbVar8;
        pbVar8 = pbVar8 + 1;
      }
      pbVar11[lVar12] = bVar4;
      lVar12 = lVar12 + 1;
    }
    pbVar5 = pbVar11 + lVar12;
    if ((AVar13.ptr + AVar13.size_ == pbVar8) && ((byte)(bVar10 + 1) < 2)) {
      (*(this->inner->super_InputStream)._vptr_InputStream[3])();
      AVar13 = kj::BufferedInputStream::getReadBuffer(this->inner);
      pbVar8 = AVar13.ptr;
      if (AVar13.size_ != 0) goto LAB_0029914c;
      iVar3 = 0x62;
LAB_002992fd:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                 ,iVar3,FAILED,"buffer.size() > 0","\"Premature end of packed input.\"",
                 (char (*) [31])"Premature end of packed input.");
      lVar12 = lVar12 - (long)dst;
      goto LAB_002992cc;
    }
  }
  else {
    bVar10 = *pbVar8;
    bVar4 = pbVar8[1];
    if ((bVar10 & 1) == 0) {
      bVar4 = 0;
    }
    *pbVar11 = bVar4;
    lVar12 = (ulong)(bVar10 & 1) + 1;
    uVar6 = bVar10 >> 1 & 1;
    pbVar11[1] = -(char)uVar6 & pbVar8[(ulong)(bVar10 & 1) + 1];
    lVar2 = (ulong)uVar6 + lVar12;
    uVar9 = bVar10 >> 2 & 1;
    pbVar11[2] = -(char)uVar9 & pbVar8[(ulong)uVar6 + lVar12];
    lVar12 = (ulong)uVar9 + lVar2;
    uVar7 = bVar10 >> 3 & 1;
    pbVar11[3] = -(char)uVar7 & pbVar8[(ulong)uVar9 + lVar2];
    uVar6 = bVar10 >> 4 & 1;
    lVar2 = (ulong)uVar7 + lVar12;
    pbVar11[4] = -(char)uVar6 & pbVar8[(ulong)uVar7 + lVar12];
    lVar12 = (ulong)uVar6 + lVar2;
    uVar7 = bVar10 >> 5 & 1;
    pbVar11[5] = -(char)uVar7 & pbVar8[(ulong)uVar6 + lVar2];
    lVar2 = (ulong)uVar7 + lVar12;
    uVar6 = bVar10 >> 6 & 1;
    pbVar11[6] = -(char)uVar6 & pbVar8[(ulong)uVar7 + lVar12];
    pbVar11[7] = (char)bVar10 >> 7 & pbVar8[(ulong)uVar6 + lVar2];
    pbVar5 = pbVar11 + 8;
    pbVar8 = pbVar8 + (ulong)(bVar10 >> 7) + (ulong)uVar6 + lVar2;
  }
LAB_0029914c:
  if (bVar10 == 0xff) {
    __n_00 = (uchar *)((ulong)*pbVar8 * 8);
    if ((long)pbVar1 - (long)pbVar5 < (long)__n_00) {
      iVar3 = 0x8b;
LAB_00299372:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                 ,iVar3,FAILED,"runLength <= outEnd - out",
                 "\"Packed input did not end cleanly on a segment boundary.\"",
                 (char (*) [56])"Packed input did not end cleanly on a segment boundary.");
      kj::_::Debug::Fault::~Fault(&f);
      return (size_t)(pbVar5 + -(long)dst);
    }
    pbVar8 = pbVar8 + 1;
    __n = AVar13.ptr + (AVar13.size_ - (long)pbVar8);
    if (__n < __n_00) {
      pbVar11 = pbVar5;
      memcpy(pbVar5,pbVar8,(size_t)__n);
      __buf = (void *)(ulong)(uint)((int)__n_00 - (int)__n);
      (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,AVar13.size_);
      kj::InputStream::read
                (&this->inner->super_InputStream,(int)(pbVar5 + (long)__n),__buf,(size_t)pbVar11);
      pbVar11 = pbVar5 + (long)__n + (long)__buf;
      if (pbVar11 == pbVar1) {
        return maxBytes;
      }
      AVar13 = kj::BufferedInputStream::getReadBuffer(this->inner);
      pbVar8 = AVar13.ptr;
      goto LAB_00298f3f;
    }
    memcpy(pbVar5,pbVar8,(size_t)__n_00);
    pbVar8 = pbVar8 + (long)__n_00;
LAB_0029923d:
    pbVar5 = pbVar5 + (long)__n_00;
  }
  else if (bVar10 == 0) {
    __n_00 = (uchar *)((ulong)*pbVar8 * 8);
    if ((long)pbVar1 - (long)pbVar5 < (long)__n_00) {
      iVar3 = 0x7f;
      goto LAB_00299372;
    }
    pbVar8 = pbVar8 + 1;
    memset(pbVar5,0,(size_t)__n_00);
    goto LAB_0029923d;
  }
  pbVar11 = pbVar5;
  if (pbVar5 == pbVar1) {
    (*(this->inner->super_InputStream)._vptr_InputStream[3])
              (this->inner,(long)pbVar8 - (long)AVar13.ptr);
    return maxBytes;
  }
  goto LAB_00298f3f;
}

Assistant:

size_t PackedInputStream::tryRead(void* dst, size_t minBytes, size_t maxBytes) {
  if (maxBytes == 0) {
    return 0;
  }

  KJ_DREQUIRE(minBytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");
  KJ_DREQUIRE(maxBytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");

  uint8_t* __restrict__ out = reinterpret_cast<uint8_t*>(dst);
  uint8_t* const outEnd = reinterpret_cast<uint8_t*>(dst) + maxBytes;
  uint8_t* const outMin = reinterpret_cast<uint8_t*>(dst) + minBytes;

  kj::ArrayPtr<const byte> buffer = inner.tryGetReadBuffer();
  if (buffer.size() == 0) {
    return 0;
  }
  const uint8_t* __restrict__ in = reinterpret_cast<const uint8_t*>(buffer.begin());

#define REFRESH_BUFFER() \
  inner.skip(buffer.size()); \
  buffer = inner.getReadBuffer(); \
  KJ_REQUIRE(buffer.size() > 0, "Premature end of packed input.") { \
    return out - reinterpret_cast<uint8_t*>(dst); \
  } \
  in = reinterpret_cast<const uint8_t*>(buffer.begin())

#define BUFFER_END (reinterpret_cast<const uint8_t*>(buffer.end()))
#define BUFFER_REMAINING ((size_t)(BUFFER_END - in))

  for (;;) {
    uint8_t tag;

    KJ_DASSERT((out - reinterpret_cast<uint8_t*>(dst)) % sizeof(word) == 0,
           "Output pointer should always be aligned here.");

    if (BUFFER_REMAINING < 10) {
      if (out >= outMin) {
        // We read at least the minimum amount, so go ahead and return.
        inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
        return out - reinterpret_cast<uint8_t*>(dst);
      }

      if (BUFFER_REMAINING == 0) {
        REFRESH_BUFFER();
        continue;
      }

      // We have at least 1, but not 10, bytes available.  We need to read slowly, doing a bounds
      // check on each byte.

      tag = *in++;

      for (uint i = 0; i < 8; i++) {
        if (tag & (1u << i)) {
          if (BUFFER_REMAINING == 0) {
            REFRESH_BUFFER();
          }
          *out++ = *in++;
        } else {
          *out++ = 0;
        }
      }

      if (BUFFER_REMAINING == 0 && (tag == 0 || tag == 0xffu)) {
        REFRESH_BUFFER();
      }
    } else {
      tag = *in++;

#define HANDLE_BYTE(n) \
      { \
         bool isNonzero = (tag & (1u << n)) != 0; \
         *out++ = *in & (-(int8_t)isNonzero); \
         in += isNonzero; \
      }

      HANDLE_BYTE(0);
      HANDLE_BYTE(1);
      HANDLE_BYTE(2);
      HANDLE_BYTE(3);
      HANDLE_BYTE(4);
      HANDLE_BYTE(5);
      HANDLE_BYTE(6);
      HANDLE_BYTE(7);
#undef HANDLE_BYTE
    }

    if (tag == 0) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= outEnd - out,
                 "Packed input did not end cleanly on a segment boundary.") {
        return out - reinterpret_cast<uint8_t*>(dst);
      }
      memset(out, 0, runLength);
      out += runLength;

    } else if (tag == 0xffu) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= outEnd - out,
                 "Packed input did not end cleanly on a segment boundary.") {
        return out - reinterpret_cast<uint8_t*>(dst);
      }

      size_t inRemaining = BUFFER_REMAINING;
      if (inRemaining >= runLength) {
        // Fast path.
        memcpy(out, in, runLength);
        out += runLength;
        in += runLength;
      } else {
        // Copy over the first buffer, then do one big read for the rest.
        memcpy(out, in, inRemaining);
        out += inRemaining;
        runLength -= inRemaining;

        inner.skip(buffer.size());
        inner.read(out, runLength);
        out += runLength;

        if (out == outEnd) {
          return maxBytes;
        } else {
          buffer = inner.getReadBuffer();
          in = reinterpret_cast<const uint8_t*>(buffer.begin());

          // Skip the bounds check below since we just did the same check above.
          continue;
        }
      }
    }

    if (out == outEnd) {
      inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
      return maxBytes;
    }
  }

  KJ_FAIL_ASSERT("Can't get here.");
  return 0;  // GCC knows KJ_FAIL_ASSERT doesn't return, but Eclipse CDT still warns...

#undef REFRESH_BUFFER
}